

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O2

int __thiscall KParser::_call(KParser *this,int begin,BlockInfo *bi)

{
  pointer pTVar1;
  uint l;
  uint uVar2;
  mapped_type *pmVar3;
  int iVar4;
  allocator local_1b9;
  string rightValue;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  BlockInfo local_b0;
  BlockInfo local_70;
  
  pTVar1 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = -1;
  if ((pTVar1[begin].tokenType == id) && (pTVar1[(long)begin + 1].tokenType == lparen)) {
    if (pTVar1[(long)begin + 2].tokenType == rparen) {
      std::__cxx11::string::string((string *)&local_d0,"call",(allocator *)&rightValue);
      std::__cxx11::string::string
                ((string *)&local_f0,
                 (string *)
                 ((this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                  super__Vector_impl_data._M_start + begin));
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->m_funcToParams,
                            &(this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                             _M_impl.super__Vector_impl_data._M_start[begin].str);
      std::__cxx11::to_string(&local_110,*pmVar3);
      addCode(this,&local_d0,&local_f0,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      iVar4 = begin + 3;
    }
    else {
      BlockInfo::BlockInfo(&local_b0,bi);
      l = _expr(this,begin + 2,&local_b0);
      BlockInfo::~BlockInfo(&local_b0);
      if ((int)l < 0) {
        std::__cxx11::string::string
                  ((string *)&rightValue,anon_var_dwarf_1357d,(allocator *)&local_190);
        addErrorString(this,begin + 2,&rightValue);
      }
      else {
        while( true ) {
          std::__cxx11::string::string
                    ((string *)&rightValue,
                     (string *)
                     ((this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + l));
          if ((this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
              super__Vector_impl_data._M_start[l].tokenType != comma) break;
          BlockInfo::BlockInfo(&local_70,bi);
          uVar2 = _expr(this,l + 1,&local_70);
          BlockInfo::~BlockInfo(&local_70);
          if ((int)uVar2 < 0) {
            std::__cxx11::string::string((string *)&local_190,anon_var_dwarf_13589,&local_1b9);
            addErrorString(this,l,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            goto LAB_0010c384;
          }
          std::__cxx11::string::~string((string *)&rightValue);
          l = uVar2;
        }
        std::__cxx11::string::~string((string *)&rightValue);
        if ((this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
            super__Vector_impl_data._M_start[l].tokenType == rparen) {
          std::__cxx11::string::string((string *)&local_130,"call",(allocator *)&rightValue);
          std::__cxx11::string::string
                    ((string *)&local_150,
                     (string *)
                     ((this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + begin));
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](&this->m_funcToParams,
                                &(this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                                 _M_impl.super__Vector_impl_data._M_start[begin].str);
          std::__cxx11::to_string(&local_170,*pmVar3);
          addCode(this,&local_130,&local_150,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_130);
          return l + 1;
        }
        std::__cxx11::string::string
                  ((string *)&rightValue,anon_var_dwarf_13595,(allocator *)&local_190);
        addErrorString(this,l,&rightValue);
      }
LAB_0010c384:
      std::__cxx11::string::~string((string *)&rightValue);
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

int KParser::_call(int begin,  BlockInfo bi) {
    // some();
    // some(a);
    // some(a,b,c);
    int i = begin;
    int t = 0;

    // 인자가 없는 경우 
    if (m_tokens[i].tokenType == TokenType::id && 
        m_tokens[i + 1].tokenType == TokenType::lparen && 
        m_tokens[i + 2].tokenType == TokenType::rparen
        ) {
        addCode("call", m_tokens[i].str,  std::to_string( m_funcToParams[m_tokens[i].str]));
        return i + 3;
    }

    // 인자가 하나이상 있는 경우
    if (m_tokens[i].tokenType == TokenType::id && 
        m_tokens[i + 1].tokenType == TokenType::lparen) {
        i = i + 2;
        // 이 까지 왔으면 매개변수가 하나이상 있는 것이다.
        t = _expr(i, bi);
        if (t < 0) {
            addErrorString(i, "함수 인자에는 표현식이 와야합니다.");
            return -1;
        }
        i = t;

        while (1) {
            int tryI = i;
            std::string rightValue = m_tokens[tryI].str;
            TokenType tokenValue = m_tokens[tryI].tokenType;
            if(tokenValue != TokenType::comma) {
                break;
            }
            tryI++;
            t = _expr(tryI, bi);
            if (t < 0) {
                addErrorString(i, ", 뒤에 표현식을 기대했습니다.");
                return -1; 
            }
            tryI = t;
            i = tryI;
        } 
        if (m_tokens[i].tokenType != TokenType::rparen) {
            addErrorString(i, "_call: ) 가 빠졌습니다.");
            return -1;
        }
        i++;
        addCode("call", m_tokens[begin].str,  std::to_string( m_funcToParams[m_tokens[begin].str]));
        return i;
    }

    return -1; 
}